

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O1

int testUVProcessChain(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  if (argc < 2) {
    pcVar3 = "Invalid arguments.\n";
    lVar2 = 0x13;
  }
  else {
    bVar1 = testUVProcessChainBuiltin(argv[1]);
    if (bVar1) {
      bVar1 = testUVProcessChainExternal(argv[1]);
      if (bVar1) {
        bVar1 = testUVProcessChainNone(argv[1]);
        if (bVar1) {
          return 0;
        }
        pcVar3 = "While executing testUVProcessChainNone().\n";
        lVar2 = 0x2a;
      }
      else {
        pcVar3 = "While executing testUVProcessChainExternal().\n";
        lVar2 = 0x2e;
      }
    }
    else {
      pcVar3 = "While executing testUVProcessChainBuiltin().\n";
      lVar2 = 0x2d;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  return -1;
}

Assistant:

int testUVProcessChain(int argc, char** const argv)
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  if (!testUVProcessChainBuiltin(argv[1])) {
    std::cout << "While executing testUVProcessChainBuiltin().\n";
    return -1;
  }

  if (!testUVProcessChainExternal(argv[1])) {
    std::cout << "While executing testUVProcessChainExternal().\n";
    return -1;
  }

  if (!testUVProcessChainNone(argv[1])) {
    std::cout << "While executing testUVProcessChainNone().\n";
    return -1;
  }

  return 0;
}